

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_engine.h
# Opt level: O0

bool __thiscall
BamTools::FilterEngine<BamTools::BamAlignmentChecker>::addProperty
          (FilterEngine<BamTools::BamAlignmentChecker> *this,string *propertyName)

{
  bool bVar1;
  __normal_iterator<BamTools::Property_*,_std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>_>
  in_RDI;
  bool found;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propertyNames;
  value_type *in_stack_ffffffffffffff48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *paVar2;
  __normal_iterator<BamTools::Property_*,_std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>_>
  __first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff78;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff80;
  FilterEngine<BamTools::BamAlignmentChecker> *in_stack_ffffffffffffff98;
  Property local_30;
  byte local_1;
  
  __first._M_current = &local_30;
  allPropertyNames_abi_cxx11_(in_stack_ffffffffffffff98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_ffffffffffffff48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)in_stack_ffffffffffffff48);
  bVar1 = std::
          binary_search<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  local_1 = !bVar1;
  if ((bool)local_1) {
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
              *)&in_RDI._M_current[1].Name._M_string_length;
    Property::Property(__first._M_current,&(in_RDI._M_current)->Name,SUB81((ulong)paVar2 >> 0x38,0))
    ;
    std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>::push_back
              ((vector<BamTools::Property,_std::allocator<BamTools::Property>_> *)paVar2,
               in_stack_ffffffffffffff48);
    Property::~Property((Property *)0x133c7f);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
              *)&in_RDI._M_current[1].Name._M_string_length;
    std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>::begin
              ((vector<BamTools::Property,_std::allocator<BamTools::Property>_> *)paVar2);
    std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>::end
              ((vector<BamTools::Property,_std::allocator<BamTools::Property>_> *)paVar2);
    std::
    sort<__gnu_cxx::__normal_iterator<BamTools::Property*,std::vector<BamTools::Property,std::allocator<BamTools::Property>>>>
              (__first,in_RDI);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)__first._M_current);
  return (bool)(local_1 & 1);
}

Assistant:

bool FilterEngine<FilterChecker>::addProperty(const std::string& propertyName)
{
    const std::vector<std::string> propertyNames = allPropertyNames();
    bool found = std::binary_search(propertyNames.begin(), propertyNames.end(), propertyName);
    if (found) {
        return false;
    }
    m_properties.push_back(Property(propertyName));
    std::sort(m_properties.begin(), m_properties.end());
    return true;
}